

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::GetLineFromStream
               (istream *is,string *line,bool *has_newline,long sizeLimit)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  char buffer [1024];
  undefined8 local_440;
  char local_438 [1032];
  
  std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,0x115116);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    if (sizeLimit == 0) {
      bVar5 = false;
      bVar4 = false;
    }
    else {
      bVar4 = false;
      bVar5 = false;
      local_440 = line;
      while( true ) {
        std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
        std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
        std::istream::getline((char *)is,(long)local_438,'\0');
        uVar1 = *(ulong *)(is + 8);
        if ((long)uVar1 < 1) break;
        sVar2 = strlen(local_438);
        if (sVar2 < uVar1) {
          bVar4 = true;
        }
        if ((sVar2 != 0) && (local_438[sVar2 - 1] == '\r')) {
          local_438[sVar2 - 1] = '\0';
        }
        lVar3 = sizeLimit;
        if ((0 < sizeLimit) && (lVar3 = sizeLimit - sVar2, sizeLimit < (long)sVar2)) {
          local_438[sizeLimit + -1] = '\0';
          lVar3 = 0;
        }
        std::__cxx11::string::append((char *)local_440);
        bVar5 = true;
        if ((bVar4) || (sizeLimit = lVar3, lVar3 == 0)) break;
      }
    }
  }
  else {
    bVar4 = false;
    bVar5 = false;
  }
  if (has_newline != (bool *)0x0) {
    *has_newline = bVar4;
  }
  return bVar5;
}

Assistant:

bool SystemTools::GetLineFromStream(kwsys_ios::istream& is,
                                    kwsys_stl::string& line,
                                    bool* has_newline /* = 0 */,
                                    long sizeLimit /* = -1 */)
{
  const int bufferSize = 1024;
  char buffer[bufferSize];
  bool haveData = false;
  bool haveNewline = false;

  // Start with an empty line.
  line = "";

  long leftToRead = sizeLimit;

  // Early short circuit return if stream is no good. Just return
  // false and the empty line. (Probably means caller tried to
  // create a file stream with a non-existent file name...)
  //
  if(!is)
    {
    if(has_newline)
      {
      *has_newline = false;
      }
    return false;
    }

  // If no characters are read from the stream, the end of file has
  // been reached.  Clear the fail bit just before reading.
  while(!haveNewline &&
        leftToRead != 0 &&
        (is.clear(is.rdstate() & ~kwsys_ios::ios::failbit),
         is.getline(buffer, bufferSize), is.gcount() > 0))
    {
    // We have read at least one byte.
    haveData = true;

    // If newline character was read the gcount includes the character
    // but the buffer does not: the end of line has been reached.
    size_t length = strlen(buffer);
    if(length < static_cast<size_t>(is.gcount()))
      {
      haveNewline = true;
      }

    // Avoid storing a carriage return character.
    if(length > 0 && buffer[length-1] == '\r')
      {
      buffer[length-1] = 0;
      }

    // if we read too much then truncate the buffer
    if (leftToRead > 0)
      {
      if (static_cast<long>(length) > leftToRead)
        {
        buffer[leftToRead-1] = 0;
        leftToRead = 0;
        }
      else
        {
        leftToRead -= static_cast<long>(length);
        }
      }

    // Append the data read to the line.
    line.append(buffer);
    }

  // Return the results.
  if(has_newline)
    {
    *has_newline = haveNewline;
    }
  return haveData;
}